

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

complex<double> __thiscall
TPZFMatrix<std::complex<double>_>::operator()
          (TPZFMatrix<std::complex<double>_> *this,int64_t row,int64_t col)

{
  undefined8 in_RAX;
  complex<double> cVar1;
  
  if ((((-1 < row) &&
       (row < (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) &&
      (-1 < col)) && (col < (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)
     ) {
    cVar1._M_value._8_8_ = col;
    cVar1._M_value._0_8_ = in_RAX;
    return (complex<double>)cVar1._M_value;
  }
  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x278);
}

Assistant:

inline TVar TPZFMatrix<TVar>::operator()( const int64_t row, const int64_t col) const {
#ifndef PZNODEBUG
    if(row >=  this->Rows() || row<0 || col >=  this->Cols() || col<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+col*this->fRow+row);
}